

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O3

Node * TagToken(TidyDocImpl *doc,NodeType type)

{
  uint uVar1;
  Lexer *pLVar2;
  Node *node;
  tmbstr ptVar3;
  
  pLVar2 = doc->lexer;
  node = (Node *)(*pLVar2->allocator->vtbl->alloc)(pLVar2->allocator,0x68);
  node->parent = (Node *)0x0;
  node->prev = (Node *)0x0;
  node->next = (Node *)0x0;
  node->content = (Node *)0x0;
  node->last = (Node *)0x0;
  node->attributes = (AttVal *)0x0;
  node->was = (Dict *)0x0;
  node->tag = (Dict *)0x0;
  node->element = (tmbstr)0x0;
  node->start = 0;
  node->end = 0;
  node->type = RootNode;
  node->line = 0;
  node->column = 0;
  node->closed = no;
  node->implicit = no;
  node->linebreak = no;
  uVar1 = pLVar2->columns;
  node->line = pLVar2->lines;
  node->column = uVar1;
  node->type = type;
  ptVar3 = prvTidytmbstrndup(doc->allocator,pLVar2->lexbuf + pLVar2->txtstart,
                             pLVar2->txtend - pLVar2->txtstart);
  node->element = ptVar3;
  uVar1 = pLVar2->txtstart;
  node->start = uVar1;
  node->end = uVar1;
  if (type - StartTag < 2) {
    prvTidyFindTag(doc,node);
  }
  return node;
}

Assistant:

static Node* TagToken( TidyDocImpl* doc, NodeType type )
{
    Lexer* lexer = doc->lexer;
    Node* node = TY_(NewNode)( lexer->allocator, lexer );
    node->type = type;
    node->element = TY_(tmbstrndup)( doc->allocator,
                                     lexer->lexbuf + lexer->txtstart,
                                     lexer->txtend - lexer->txtstart );
    node->start = lexer->txtstart;
    node->end = lexer->txtstart;

    if ( type == StartTag || type == StartEndTag || type == EndTag )
        TY_(FindTag)(doc, node);

    return node;
}